

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::(anonymous_namespace)::DynamicMessageTest_Extensions_Test::
~DynamicMessageTest_Extensions_Test(DynamicMessageTest_Extensions_Test *this)

{
  protobuf::anon_unknown_0::DynamicMessageTest_Extensions_Test::~DynamicMessageTest_Extensions_Test
            ((DynamicMessageTest_Extensions_Test *)(this + -0x10));
  return;
}

Assistant:

TEST_P(DynamicMessageTest, Extensions) {
  // Check that extensions work.
  Arena arena;
  Message* message = extensions_prototype_->New(use_arena() ? &arena : nullptr);
  TestUtil::ReflectionTester reflection_tester(extensions_descriptor_);

  reflection_tester.SetAllFieldsViaReflection(message);
  reflection_tester.ExpectAllFieldsSetViaReflection(*message);

  if (!use_arena()) {
    delete message;
  }
}